

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Stop(Benchmark *this,Slice *name)

{
  string *__rhs;
  FILE *pFVar1;
  int iVar2;
  Env *pEVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined1 auVar5 [16];
  allocator local_109;
  double local_108;
  double dStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char rate [100];
  
  pEVar3 = Env::Default();
  iVar2 = (*pEVar3->_vptr_Env[0x13])(pEVar3);
  auVar5._4_4_ = extraout_var;
  auVar5._0_4_ = iVar2;
  auVar5._8_4_ = extraout_var;
  auVar5._12_4_ = 0x45300000;
  dStack_100 = auVar5._8_8_ - 1.9342813113834067e+25;
  if (this->done_ < 1) {
    this->done_ = 1;
  }
  local_108 = (dStack_100 + ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 1e-06;
  if (0 < this->bytes_) {
    snprintf(rate,100,"%6.1f MB/s",
             ((double)this->bytes_ * 9.5367431640625e-07) / (local_108 - this->start_));
    __rhs = &this->message_;
    if ((this->message_)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)__rhs);
    }
    else {
      std::__cxx11::string::string((string *)&local_d8,rate,&local_109);
      std::operator+(&local_f8,&local_d8," ");
      std::operator+(&local_b8,&local_f8,__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  pFVar1 = _stdout;
  Slice::ToString_abi_cxx11_((string *)rate,name);
  pcVar4 = " ";
  if ((this->message_)._M_string_length == 0) {
    pcVar4 = "";
  }
  fprintf(pFVar1,"%-12s : %11.3f micros/op;%s%s\n",
          ((local_108 - this->start_) * 1000000.0) / (double)this->done_,rate._0_8_,pcVar4,
          (this->message_)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)rate);
  pFVar1 = _stdout;
  if (FLAGS_histogram == true) {
    Histogram::ToString_abi_cxx11_((string *)rate,&this->hist_);
    fprintf(pFVar1,"Microseconds per op:\n%s\n",rate._0_8_);
    std::__cxx11::string::~string((string *)rate);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Stop(const Slice& name) {
    double finish = Env::Default()->NowMicros() * 1e-6;

    // Pretend at least one op was done in case we are running a benchmark
    // that does not call FinishedSingleOp().
    if (done_ < 1) done_ = 1;

    if (bytes_ > 0) {
      char rate[100];
      snprintf(rate, sizeof(rate), "%6.1f MB/s",
               (bytes_ / 1048576.0) / (finish - start_));
      if (!message_.empty()) {
        message_ = std::string(rate) + " " + message_;
      } else {
        message_ = rate;
      }
    }

    fprintf(stdout, "%-12s : %11.3f micros/op;%s%s\n", name.ToString().c_str(),
            (finish - start_) * 1e6 / done_, (message_.empty() ? "" : " "),
            message_.c_str());
    if (FLAGS_histogram) {
      fprintf(stdout, "Microseconds per op:\n%s\n", hist_.ToString().c_str());
    }
    fflush(stdout);
  }